

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O2

difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
* __thiscall
burst::
make_difference_iterator<std::forward_list<int,std::allocator<int>>const&,std::forward_list<int,std::allocator<int>>const&,void>
          (difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,forward_list<int,_std::allocator<int>_> *minuend,
          forward_list<int,_std::allocator<int>_> *subtrahend)

{
  difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
  ::difference_iterator
            (__return_storage_ptr__,*(undefined8 *)this,0,
             (minuend->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next,0);
  return __return_storage_ptr__;
}

Assistant:

auto make_difference_iterator (ForwardRange1 && minuend, ForwardRange2 && subtrahend)
    {
        using std::begin;
        using std::end;
        return
            make_difference_iterator
            (
                begin(std::forward<ForwardRange1>(minuend)),
                end(std::forward<ForwardRange1>(minuend)),
                begin(std::forward<ForwardRange2>(subtrahend)),
                end(std::forward<ForwardRange2>(subtrahend))
            );
    }